

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::permute_axes(CImg<unsigned_char> *this,char *axes_order)

{
  CImg<unsigned_char> *pCVar1;
  CImg<unsigned_char> local_38;
  char *local_18;
  char *axes_order_local;
  CImg<unsigned_char> *this_local;
  
  local_18 = axes_order;
  axes_order_local = (char *)this;
  get_permute_axes(&local_38,this,axes_order);
  pCVar1 = move_to(&local_38,this);
  ~CImg(&local_38);
  return pCVar1;
}

Assistant:

CImg<T>& permute_axes(const char *const axes_order) {
      return get_permute_axes(axes_order).move_to(*this);
    }